

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O3

PSNode * __thiscall
dg::pta::LLVMPointerGraphBuilder::createFree(LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  PSNode *pPVar1;
  Instruction *pIVar2;
  PSNode *op1;
  PSNode *local_10;
  
  if ((*(uint *)(Inst + 0x14) >> 0x1e & 1) == 0) {
    pIVar2 = Inst + -(ulong)(*(uint *)(Inst + 0x14) << 5);
  }
  else {
    pIVar2 = *(Instruction **)(Inst + -8);
  }
  local_10 = getOperand(this,*(Value **)pIVar2);
  pPVar1 = PointerGraph::create<(dg::pta::PSNodeType)16,dg::pta::PSNode*&>
                     ((PointerGraph *)this,&local_10);
  return pPVar1;
}

Assistant:

PSNode *LLVMPointerGraphBuilder::createFree(const llvm::Instruction *Inst) {
    PSNode *op1 = getOperand(Inst->getOperand(0));
    PSNode *node = PS.create<PSNodeType::FREE>(op1);

    return node;
}